

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O3

void Fra_ClassesLatchCorr(Fra_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  void *pvVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Aig_Obj_t **ppAVar7;
  uint uVar8;
  size_t __size;
  ulong uVar9;
  Fra_Cla_t *pFVar10;
  
  pFVar10 = p->pCla;
  pFVar10->vClasses1->nSize = 0;
  pAVar3 = p->pManAig;
  uVar8 = pAVar3->nObjs[2] - pAVar3->nRegs;
  pVVar5 = pAVar3->vCis;
  if ((int)uVar8 < pVVar5->nSize) {
    uVar9 = (ulong)uVar8;
    do {
      if ((int)uVar8 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar4 = pVVar5->pArray[uVar9];
      pVVar5 = p->pCla->vClasses1;
      uVar1 = pVVar5->nSize;
      if (uVar1 == pVVar5->nCap) {
        if ((int)uVar1 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = 0x10;
        }
        else {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = uVar1 * 2;
        }
      }
      else {
        ppvVar6 = pVVar5->pArray;
      }
      iVar2 = pVVar5->nSize;
      pVVar5->nSize = iVar2 + 1;
      ppvVar6[iVar2] = pvVar4;
      *(Aig_Obj_t **)
       (*(long *)(*(long *)(*(long *)((long)pvVar4 + 0x28) + 0x30) + 8) +
       (long)*(int *)((long)pvVar4 + 0x24) * 8) = p->pManAig->pConst1;
      uVar9 = uVar9 + 1;
      pVVar5 = p->pManAig->vCis;
    } while ((int)uVar9 < pVVar5->nSize);
    pFVar10 = p->pCla;
    __size = (long)pFVar10->vClasses1->nSize << 4;
  }
  else {
    __size = 0;
  }
  ppAVar7 = (Aig_Obj_t **)malloc(__size);
  pFVar10->pMemClasses = ppAVar7;
  pFVar10->pMemClassesFree = ppAVar7;
  return;
}

Assistant:

void Fra_ClassesLatchCorr( Fra_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, nEntries = 0;
    Vec_PtrClear( p->pCla->vClasses1 );
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
    {
        Vec_PtrPush( p->pCla->vClasses1, pObj );
        Fra_ClassObjSetRepr( pObj, Aig_ManConst1(p->pManAig) );
    }
    // allocate room for classes
    p->pCla->pMemClasses = ABC_ALLOC( Aig_Obj_t *, 2*(nEntries + Vec_PtrSize(p->pCla->vClasses1)) );
    p->pCla->pMemClassesFree = p->pCla->pMemClasses + 2*nEntries;
}